

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

bool __thiscall amrex::ParmParse::contains(ParmParse *this,char *name)

{
  bool bVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  allocator local_81;
  ParmParse *local_80;
  string local_78;
  _List_node_base *local_58;
  string local_50;
  
  p_Var2 = (_List_node_base *)this->m_table;
  local_80 = this;
  local_58 = p_Var2;
  do {
    p_Var2 = (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == local_58) goto LAB_00528777;
    std::__cxx11::string::string((string *)&local_78,name,&local_81);
    prefixedName(&local_50,local_80,&local_78);
    bVar1 = anon_unknown_12::ppfound(&local_50,(PP_entry *)(p_Var2 + 1),false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  } while (!bVar1);
  p_Var3 = (local_80->m_table->
           super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)local_80->m_table) {
    do {
      std::__cxx11::string::string((string *)&local_78,name,&local_81);
      prefixedName(&local_50,local_80,&local_78);
      bVar1 = anon_unknown_12::ppfound(&local_50,(PP_entry *)(p_Var3 + 1),false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) {
        *(undefined1 *)&p_Var3[5]._M_next = 1;
      }
      p_Var3 = (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)local_80->m_table);
  }
LAB_00528777:
  return p_Var2 != local_58;
}

Assistant:

bool
ParmParse::contains (const char* name) const
{
    for ( const_list_iterator li = m_table.begin(), End = m_table.end(); li != End; ++li )
    {
       if ( ppfound(prefixedName(name), *li, false))
       {
           //
           // Found an entry; mark all occurrences of name as used.
           //
           for ( const_list_iterator lli = m_table.begin(); lli != m_table.end(); ++lli )
           {
               if ( ppfound(prefixedName(name), *lli, false) )
               {
                   lli->m_queried = true;
               }
           }
           return true;
       }
    }
    return false;
}